

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<std::__cxx11::string,char[61]>
          (char *lhs_expression,char *rhs_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [61])

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  AssertionResult AVar3;
  char (*in_stack_00000030) [61];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  
  bVar1 = std::operator==(in_RDI,(char *)in_RDI);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = CmpHelperEQFailure<std::__cxx11::string,char[61]>
                      (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}